

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

u32string * LiteScript::String::ConvertToUnicode(u32string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  byte *pbVar5;
  reference local_78;
  reference local_60 [2];
  reference local_40;
  bitset<4UL> local_30;
  bitset<4UL> header;
  uint local_20;
  uint sz;
  uint i;
  string *str_local;
  u32string *res;
  
  std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__);
  local_20 = 0;
  header.super__Base_bitset<1UL>._M_w._4_4_ = std::__cxx11::string::size();
  do {
    if (header.super__Base_bitset<1UL>._M_w._4_4_ <= local_20) {
      return __return_storage_ptr__;
    }
    pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
    std::bitset<4UL>::bitset(&local_30,(ulong)(*pbVar5 >> 4));
    std::bitset<4UL>::operator[]((bitset<4UL> *)&local_40,(size_t)&local_30);
    bVar4 = std::bitset::reference::operator_cast_to_bool((reference *)&local_40);
    std::bitset<4UL>::reference::~reference(&local_40);
    if (bVar4) {
      std::bitset<4UL>::operator[]((bitset<4UL> *)local_60,(size_t)&local_30);
      bVar4 = std::bitset::reference::operator_cast_to_bool((reference *)local_60);
      std::bitset<4UL>::reference::~reference(local_60);
      if (bVar4) {
        std::bitset<4UL>::operator[]((bitset<4UL> *)&local_78,(size_t)&local_30);
        bVar4 = std::bitset::reference::operator_cast_to_bool((reference *)&local_78);
        std::bitset<4UL>::reference::~reference(&local_78);
        if (bVar4) {
          if (header.super__Base_bitset<1UL>._M_w._4_4_ - 3 <= local_20) {
            return __return_storage_ptr__;
          }
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
          bVar1 = *pbVar5;
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
          bVar2 = *pbVar5;
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
          bVar3 = *pbVar5;
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (__return_storage_ptr__,
                     (bVar1 & 7) << 0x12 | (bVar2 & 0x3f) << 0xc | (bVar3 & 0x3f) << 6 |
                     *pbVar5 & 0x3f);
          local_20 = local_20 + 3;
        }
        else {
          if (header.super__Base_bitset<1UL>._M_w._4_4_ - 2 <= local_20) {
            return __return_storage_ptr__;
          }
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
          bVar1 = *pbVar5;
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
          bVar2 = *pbVar5;
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (__return_storage_ptr__,
                     (bVar1 & 0xf) << 0xc | (bVar2 & 0x3f) << 6 | *pbVar5 & 0x3f);
          local_20 = local_20 + 2;
        }
      }
      else {
        if (header.super__Base_bitset<1UL>._M_w._4_4_ - 1 <= local_20) {
          return __return_storage_ptr__;
        }
        pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
        bVar1 = *pbVar5;
        pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(__return_storage_ptr__,(bVar1 & 0x1f) << 6 | *pbVar5 & 0x3f);
        local_20 = local_20 + 1;
      }
    }
    else {
      pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)str);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(__return_storage_ptr__,(uint)*pbVar5);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::u32string LiteScript::String::ConvertToUnicode(const std::string& str) {
    std::u32string res;
    for (unsigned int i = 0, sz = str.size(); i < sz; i++) {
        std::bitset<4> header(((unsigned char)str[i] & (unsigned char)0b11110000) >> 4);
        if (header[3] == 0) {
            //1 byte
            res.push_back((unsigned char)str[i]);
        }
        else if (header[1] == 0) {
            //2 bytes
            if (i >= sz - 1) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00011111) << 6) |
                          (char32_t) ((unsigned char) str[i + 1] & 0b00111111));
            i += 1;
        }
        else if (header[0] == 0) {
            //3 bytes
            if (i >= sz - 2) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00001111) << 12) |
                          ((char32_t) ((unsigned char) str[i + 1] & 0b00111111) << 6) |
                          (char32_t) ((unsigned char) str[i + 2] & 0b00111111));
            i += 2;
        }
        else {
            //4 bytes
            if (i >= sz - 3) return res;
            res.push_back(((char32_t) ((unsigned char) str[i] & 0b00000111) << 18) |
                          ((char32_t) ((unsigned char) str[i + 1] & 0b00111111) << 12) |
                          ((char32_t) ((unsigned char) str[i + 2] & 0b00111111) << 6) |
                          (char32_t) ((unsigned char) str[i + 3] & 0b00111111));
            i += 3;
        }
    }
    return res;
}